

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::Type::Type(Type *this,initializer_list<wasm::Type> types)

{
  Type TVar1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_38;
  allocator_type local_19;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_38,types,&local_19);
  TVar1 = anon_unknown_0::TupleStore::insert
                    ((TupleStore *)wasm::(anonymous_namespace)::globalTupleStore,&local_38);
  this->id = (uintptr_t)TVar1;
  if (local_38.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Type::Type(std::initializer_list<Type> types) : Type(Tuple(types)) {}